

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

ssize_t uv__fs_buf_iter(uv_fs_t *req,uv__fs_buf_iter_processor process)

{
  uv_buf_t *ptr;
  uint uVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  
  uVar1 = uv__getiovmax();
  uVar5 = req->nbufs;
  ptr = req->bufs;
  if (uVar5 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      uVar2 = uVar1;
      if (uVar5 < uVar1) {
        uVar2 = uVar5;
      }
      req->nbufs = uVar2;
      sVar3 = (*process)(req);
      if (sVar3 < 1) {
        if (lVar6 == 0) {
          lVar6 = sVar3;
        }
        break;
      }
      if (-1 < req->off) {
        req->off = req->off + sVar3;
      }
      req->bufs = req->bufs + req->nbufs;
      lVar6 = lVar6 + sVar3;
      uVar5 = uVar5 - req->nbufs;
    } while (uVar5 != 0);
  }
  piVar4 = __errno_location();
  if ((*piVar4 != 4) || (lVar6 != -1)) {
    if (ptr != req->bufsml) {
      uv__free(ptr);
    }
    req->bufs = (uv_buf_t *)0x0;
    req->nbufs = 0;
  }
  return lVar6;
}

Assistant:

static ssize_t uv__fs_buf_iter(uv_fs_t* req, uv__fs_buf_iter_processor process) {
  unsigned int iovmax;
  unsigned int nbufs;
  uv_buf_t* bufs;
  ssize_t total;
  ssize_t result;

  iovmax = uv__getiovmax();
  nbufs = req->nbufs;
  bufs = req->bufs;
  total = 0;

  while (nbufs > 0) {
    req->nbufs = nbufs;
    if (req->nbufs > iovmax)
      req->nbufs = iovmax;

    result = process(req);
    if (result <= 0) {
      if (total == 0)
        total = result;
      break;
    }

    if (req->off >= 0)
      req->off += result;

    req->bufs += req->nbufs;
    nbufs -= req->nbufs;
    total += result;
  }

  if (errno == EINTR && total == -1)
    return total;

  if (bufs != req->bufsml)
    uv__free(bufs);

  req->bufs = NULL;
  req->nbufs = 0;

  return total;
}